

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O1

bool __thiscall UnifiedRegex::OctoquadIdentifier::AppendChar(OctoquadIdentifier *this,Char c)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (7 < this->currPatternLength) {
    return false;
  }
  if ((uint)this->currPatternNum < 2) {
    iVar2 = GetOrAddCharCode(this,c);
    bVar3 = -1 < iVar2;
    if (bVar3) {
      iVar1 = this->currPatternLength;
      this->currPatternLength = iVar1 + 1;
      this->patternBits[this->currPatternNum][iVar1] = (char)(1 << ((byte)iVar2 & 0x1f));
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool OctoquadIdentifier::AppendChar(Char c)
    {
        if (currPatternLength >= TrigramInfo::PatternLength || currPatternNum < 0 || currPatternNum >= NumPatterns)
            return false;
        int code = GetOrAddCharCode(c);
        if (code < 0)
            return false;
        patternBits[currPatternNum][currPatternLength++] = 1 << code;
        return true;
    }